

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::getTessellationEvaluationInLayoutString_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,TessPrimitiveType primType,
          bool usePointMode)

{
  char *pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  byte local_15;
  TessPrimitiveType local_14;
  bool usePointMode_local;
  string *psStack_10;
  TessPrimitiveType primType_local;
  
  local_14 = (TessPrimitiveType)this;
  local_15 = (byte)primType & 1;
  psStack_10 = __return_storage_ptr__;
  std::__cxx11::string::string((string *)&local_98);
  std::operator+(&local_78,&local_98,"layout (");
  pcVar1 = anon_unknown_1::getTessPrimitiveTypeShaderName(local_14);
  std::operator+(&local_58,&local_78,pcVar1);
  pcVar1 = "";
  if ((local_15 & 1) != 0) {
    pcVar1 = ", point_mode";
  }
  std::operator+(&local_38,&local_58,pcVar1);
  std::operator+(__return_storage_ptr__,&local_38,") in;\n");
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  return __return_storage_ptr__;
}

Assistant:

static inline string getTessellationEvaluationInLayoutString (TessPrimitiveType primType, bool usePointMode=false)
{
	return string() + "layout (" + getTessPrimitiveTypeShaderName(primType)
								 + (usePointMode ? ", point_mode" : "")
								 + ") in;\n";
}